

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar3;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_28,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
  }
  if (((byte)field[1] & 8) == 0) {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    if (bVar1) {
      this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      this_01 = internal::MapFieldBase::GetRepeatedField(this_00);
    }
    else {
      this_01 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    pMVar3 = &internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                        (this_01,index)->super_MessageLite;
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar3 = internal::ExtensionSet::GetRepeatedMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        *(int *)(field + 4),index);
  }
  return (Message *)pMVar3;
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}